

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O3

bool __thiscall clickhouse::TypeParser::Parse(TypeParser *this,TypeAst *type)

{
  TypeAst **__args;
  iterator *piVar1;
  int iVar2;
  _Map_pointer pppTVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Code CVar5;
  Meta MVar6;
  _Elt_pointer ppTVar7;
  int *piVar8;
  long lVar9;
  const_iterator cVar10;
  undefined8 uVar11;
  ushort uVar12;
  TypeAst *pTVar13;
  size_type __rlen;
  deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>> *this_00;
  TypeAst local_c8;
  Token local_58;
  deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>> *local_40;
  size_type **local_38;
  
  __args = &this->type_;
  this->type_ = type;
  this_00 = (deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>> *)
            &this->open_elements_;
  ppTVar7 = (this->open_elements_).c.
            super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  local_40 = this_00;
  if (ppTVar7 ==
      (this->open_elements_).c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>>::
    _M_push_back_aux<clickhouse::TypeAst*const&>(this_00,__args);
  }
  else {
    *ppTVar7 = type;
    piVar1 = &(this->open_elements_).c.
              super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
switchD_0014a225_default:
  paVar4 = &local_c8.name.field_2;
  NextToken(&local_58,this);
  switch(local_58.type) {
  case Invalid:
    goto LAB_0014a670;
  case Assign:
  case Comma:
    ppTVar7 = (this->open_elements_).c.
              super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar7 ==
        (this->open_elements_).c.
        super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppTVar7 = (this->open_elements_).c.
                super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    *__args = ppTVar7[-1];
    std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::pop_back
              ((deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_> *)this_00);
    local_c8._0_8_ = (size_type **)0x0;
    local_c8.name._M_string_length = 0;
    local_c8.value_string._M_string_length = 0;
    local_c8.value_string.field_2._8_8_ = 0;
    local_c8.name.field_2._8_8_ = 0;
    local_c8.value = 0;
    local_c8.name.field_2._M_allocated_capacity = 0;
    local_c8.value_string._M_dataplus._M_p = (pointer)&local_c8.value_string.field_2;
    local_c8.value_string.field_2._M_allocated_capacity = 0;
    local_c8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.name._M_dataplus._M_p = (pointer)paVar4;
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
    emplace_back<clickhouse::TypeAst>(&(*__args)->elements,&local_c8);
    break;
  case Name:
    switch(local_58.value._M_len) {
    case 4:
      if (*(int *)local_58.value._M_str != 0x6c6c754e) goto switchD_0014a4b7_caseD_7;
      MVar6 = Null;
      break;
    case 5:
      if (*(char *)((long)local_58.value._M_str + 4) == 'y' &&
          *(int *)local_58.value._M_str == 0x61727241) {
        MVar6 = Array;
      }
      else {
        if (*(char *)((long)local_58.value._M_str + 4) != 'e' ||
            *(int *)local_58.value._M_str != 0x6c707554) {
          iVar2 = *(int *)local_58.value._M_str;
          uVar12 = *(byte *)((long)local_58.value._M_str + 4) ^ 0x38;
          goto LAB_0014a561;
        }
        MVar6 = Tuple;
      }
      break;
    case 6:
      iVar2 = *(int *)local_58.value._M_str;
      uVar12 = *(ushort *)((long)local_58.value._M_str + 4) ^ 0x3631;
LAB_0014a561:
      if (uVar12 != 0 || iVar2 != 0x6d756e45) goto switchD_0014a4b7_caseD_7;
      MVar6 = Enum;
      break;
    default:
switchD_0014a4b7_caseD_7:
      MVar6 = Terminal;
      break;
    case 8:
      if (*(long *)local_58.value._M_str != 0x656c62616c6c754e) goto switchD_0014a4b7_caseD_7;
      MVar6 = Nullable;
    }
    (*__args)->meta = MVar6;
    local_c8._0_8_ = (size_type **)((long)&local_c8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,local_58.value._M_str,
               local_58.value._M_len + (long)local_58.value._M_str);
    std::__cxx11::string::operator=((string *)&(*__args)->name,(string *)&local_c8);
    if ((size_type **)local_c8._0_8_ != (size_type **)((long)&local_c8 + 0x10U)) {
      operator_delete((void *)local_c8._0_8_,local_c8.name._M_string_length + 1);
    }
    cVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)kTypeCode_abi_cxx11_,&(*__args)->name);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_true>
        ._M_cur == (__node_type *)0x0) {
      CVar5 = Void;
    }
    else {
      CVar5 = *(Code *)((long)cVar10.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_true>
                              ._M_cur + 0x28);
    }
    (*__args)->code = CVar5;
    this_00 = local_40;
    goto switchD_0014a225_default;
  case Number:
    (*__args)->meta = Number;
    local_c8._0_8_ = (long)&local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,local_58.value._M_str,
               local_58.value._M_len + (long)local_58.value._M_str);
    uVar11 = local_c8._0_8_;
    piVar8 = __errno_location();
    iVar2 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol((char *)uVar11,(char **)&local_38,10);
    if (local_38 == (size_type **)uVar11) {
      std::__throw_invalid_argument("stol");
LAB_0014a68e:
      uVar11 = std::__throw_out_of_range("stol");
      TypeAst::~TypeAst(&local_c8);
      _Unwind_Resume(uVar11);
    }
    if (*piVar8 == 0) {
      *piVar8 = iVar2;
    }
    else if (*piVar8 == 0x22) goto LAB_0014a68e;
    (*__args)->value = lVar9;
    if ((size_type **)local_c8._0_8_ != (size_type **)((long)&local_c8 + 0x10U)) {
      operator_delete((void *)local_c8._0_8_,local_c8.name._M_string_length + 1);
    }
    goto switchD_0014a225_default;
  case String:
    (*__args)->meta = String;
    local_c8._0_8_ = (size_type **)((long)&local_c8 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,local_58.value._M_str,
               local_58.value._M_len + (long)local_58.value._M_str);
    std::__cxx11::string::operator=((string *)&(*__args)->value_string,(string *)&local_c8);
    if ((size_type **)local_c8._0_8_ != (size_type **)((long)&local_c8 + 0x10U)) {
      operator_delete((void *)local_c8._0_8_,local_c8.name._M_string_length + 1);
    }
    goto switchD_0014a225_default;
  case LPar:
    local_c8._0_8_ = (size_type **)0x0;
    local_c8.name._M_string_length = 0;
    local_c8.value_string._M_string_length = 0;
    local_c8.value_string.field_2._8_8_ = 0;
    local_c8.name.field_2._8_8_ = 0;
    local_c8.value = 0;
    local_c8.name.field_2._M_allocated_capacity = 0;
    local_c8.value_string._M_dataplus._M_p = (pointer)&local_c8.value_string.field_2;
    local_c8.value_string.field_2._M_allocated_capacity = 0;
    local_c8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.name._M_dataplus._M_p = (pointer)paVar4;
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
    emplace_back<clickhouse::TypeAst>(&(*__args)->elements,&local_c8);
    break;
  case RPar:
    goto switchD_0014a225_caseD_6;
  case EOS:
    pppTVar3 = (this->open_elements_).c.
               super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    return ((long)(this->open_elements_).c.
                  super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(this->open_elements_).c.
                  super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)(this->open_elements_).c.
                  super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(this->open_elements_).c.
                  super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)pppTVar3 -
                     (long)(this->open_elements_).c.
                           super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(pppTVar3 == (_Map_pointer)0x0)) * 0x40 == 1;
  default:
    goto switchD_0014a225_default;
  }
  std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::~vector
            (&local_c8.elements);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.value_string._M_dataplus._M_p != &local_c8.value_string.field_2) {
    operator_delete(local_c8.value_string._M_dataplus._M_p,
                    local_c8.value_string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_c8.name._M_dataplus._M_p,local_c8.name.field_2._M_allocated_capacity + 1);
  }
  ppTVar7 = (this->open_elements_).c.
            super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (ppTVar7 ==
      (this->open_elements_).c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<clickhouse::TypeAst*,std::allocator<clickhouse::TypeAst*>>::
    _M_push_back_aux<clickhouse::TypeAst*const&>(this_00,__args);
    pTVar13 = *__args;
  }
  else {
    pTVar13 = this->type_;
    *ppTVar7 = pTVar13;
    piVar1 = &(this->open_elements_).c.
              super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  *__args = (pTVar13->elements).
            super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
  goto switchD_0014a225_default;
switchD_0014a225_caseD_6:
  ppTVar7 = (this->open_elements_).c.
            super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (ppTVar7 ==
      (this->open_elements_).c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppTVar7 = (this->open_elements_).c.
              super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  *__args = ppTVar7[-1];
  std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::pop_back
            ((deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_> *)this_00);
  goto switchD_0014a225_default;
LAB_0014a670:
  return false;
}

Assistant:

bool TypeParser::Parse(TypeAst* type) {
    type_ = type;
    open_elements_.push(type_);

    do {
        const Token& token = NextToken();

        switch (token.type) {
            case Token::Name:
                type_->meta = GetTypeMeta(token.value);
                type_->name = std::string(token.value);
                type_->code = GetTypeCode(type_->name);
                break;
            case Token::Number:
                type_->meta = TypeAst::Number;
                type_->value = std::stol(std::string(token.value));
                break;
            case Token::String:
                type_->meta = TypeAst::String;
                type_->value_string = std::string(token.value);
                break;
            case Token::LPar:
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::RPar:
                type_ = open_elements_.top();
                open_elements_.pop();
                break;
            case Token::Assign:
            case Token::Comma:
                type_ = open_elements_.top();
                open_elements_.pop();
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::EOS:
                // Ubalanced braces, brackets, etc is an error.
                if (open_elements_.size() != 1) {
                    return false;
                }
                return true;
            case Token::Invalid:
                return false;
        }
    } while (true);
}